

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

bool __thiscall Lexer::isPath(Lexer *this,string *token,Type *type)

{
  size_t sVar1;
  long lVar2;
  bool bVar3;
  char cVar4;
  pointer pcVar5;
  uint uVar6;
  uint uVar7;
  size_t local_58;
  long *local_50 [2];
  long local_40 [2];
  
  if (this->_enablePath != true) {
    return false;
  }
  pcVar5 = (this->_text)._M_dataplus._M_p;
  local_58 = this->_cursor;
  if (pcVar5[local_58] != '/') {
    return false;
  }
  uVar7 = 0;
LAB_00105837:
  do {
    uVar6 = uVar7;
    sVar1 = local_58 + 1;
    lVar2 = local_58 + 1;
    local_58 = sVar1;
    if (((pcVar5[lVar2] == '\0') || (bVar3 = unicodeWhitespace((int)pcVar5[lVar2]), bVar3)) ||
       ((this->_text)._M_dataplus._M_p[local_58] == '/')) {
LAB_001058c3:
      if (local_58 <= this->_cursor || uVar6 < 3) {
        return false;
      }
      *type = path;
      std::__cxx11::string::substr((ulong)local_50,(ulong)this);
      std::__cxx11::string::operator=((string *)token,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      this->_cursor = local_58;
      return true;
    }
    utf8_next_char(&this->_text,&local_58);
    cVar4 = (this->_text)._M_dataplus._M_p[local_58];
    if (cVar4 == '\0') goto LAB_001058c3;
    uVar7 = uVar6 + 1;
    while( true ) {
      bVar3 = unicodeWhitespace((int)cVar4);
      pcVar5 = (this->_text)._M_dataplus._M_p;
      if (bVar3) break;
      if (pcVar5[local_58] == '/') goto LAB_00105837;
      utf8_next_char(&this->_text,&local_58);
      cVar4 = (this->_text)._M_dataplus._M_p[local_58];
      if (cVar4 == '\0') goto LAB_001058c3;
    }
    if (pcVar5[local_58] != '/') goto LAB_001058c3;
  } while( true );
}

Assistant:

bool Lexer::isPath (std::string& token, Lexer::Type& type)
{
  if (_enablePath)
  {
    std::size_t marker = _cursor;
    int slashCount = 0;

    while (1)
    {
      if (_text[marker] == '/')
      {
        ++marker;
        ++slashCount;
      }
      else
        break;

      if (_text[marker] &&
          ! unicodeWhitespace (_text[marker]) &&
          _text[marker] != '/')
      {
        utf8_next_char (_text, marker);
        while (_text[marker] &&
               ! unicodeWhitespace (_text[marker]) &&
               _text[marker] != '/')
          utf8_next_char (_text, marker);
      }
      else
        break;
    }

    if (marker > _cursor &&
        slashCount > 3)
    {
      type = Lexer::Type::path;
      token = _text.substr (_cursor, marker - _cursor);
      _cursor = marker;
      return true;
    }
  }

  return false;
}